

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_define_env.cpp
# Opt level: O2

void skiwi::global_define_environment_allocation
               (Program *prog,environment_map *env,repl_data *data,context *ctxt)

{
  pointer pvVar1;
  int iVar2;
  Expressions *__range2;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *exp;
  pointer exp_00;
  global_define_env_visitor gdev;
  
  if (prog->alpha_converted != false) {
    gdev.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
    _vptr_base_visitor = (_func_int **)&PTR__previsit_002ab928;
    gdev.env.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    gdev.env.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&gdev.env.
               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
              ,&env->
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             );
    gdev.rd = data;
    gdev.p_ctxt = ctxt;
    iVar2 = (*gdev.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
              _vptr_base_visitor[0x18])(&gdev,prog);
    if ((char)iVar2 != '\0') {
      pvVar1 = (prog->expressions).
               super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (exp_00 = (prog->expressions).
                    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; exp_00 != pvVar1; exp_00 = exp_00 + 1
          ) {
        visitor<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_skiwi::(anonymous_namespace)::global_define_env_visitor>
        ::visit(exp_00,&gdev);
      }
    }
    (*gdev.super_base_visitor<skiwi::(anonymous_namespace)::global_define_env_visitor>.
      _vptr_base_visitor[0x31])(&gdev,prog);
    prog->global_define_env_allocated = true;
    anon_unknown_1::global_define_env_visitor::~global_define_env_visitor(&gdev);
    return;
  }
  __assert_fail("prog.alpha_converted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/global_define_env.cpp"
                ,0x22,
                "void skiwi::global_define_environment_allocation(Program &, environment_map &, repl_data &, context &)"
               );
}

Assistant:

void global_define_environment_allocation(Program& prog, environment_map& env, repl_data& data, context& ctxt)
  {
  assert(prog.alpha_converted);
  global_define_env_visitor gdev;
  gdev.env = env;
  gdev.rd = &data;
  gdev.p_ctxt = &ctxt;
  visitor<Program, global_define_env_visitor>::visit(prog, &gdev);
  prog.global_define_env_allocated = true;
  }